

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ArgumentMismatch * CLI::ArgumentMismatch::PartialType(string *name,int num,string *type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff3c;
  string local_c0 [24];
  string *in_stack_ffffffffffffff58;
  ArgumentMismatch *in_stack_ffffffffffffff60;
  string local_80 [32];
  string local_60 [32];
  string local_40 [64];
  
  __lhs = in_RDI;
  ::std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  ::std::operator+(__lhs,in_RDI);
  ::std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::to_string(in_stack_ffffffffffffff3c);
  ::std::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  ::std::operator+(__lhs,(char *)in_RDI);
  ArgumentMismatch(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  ::std::__cxx11::string::~string(local_40);
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  ::std::__cxx11::string::~string(local_c0);
  return (ArgumentMismatch *)__lhs;
}

Assistant:

static ArgumentMismatch PartialType(std::string name, int num, std::string type) {
        return ArgumentMismatch(name + ": " + type + " only partially specified: " + std::to_string(num) +
                                " required for each element");
    }